

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void GradientFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  unkuint9 Var31;
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  unkuint9 Var34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  long lVar42;
  char cVar43;
  int iVar44;
  int iVar45;
  int i;
  long lVar46;
  uint8_t *puVar47;
  uint8_t *puVar48;
  uint8_t *puVar49;
  uint length;
  long lVar50;
  long lVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  uint8_t *local_48;
  
  *filtered_data = *data;
  length = width - 1;
  PredictLineLeft_SSE2(data + 1,filtered_data + 1,length);
  lVar42 = (long)stride;
  puVar48 = filtered_data + lVar42 + 1;
  puVar49 = data + 1;
  iVar45 = 1;
  lVar51 = 1;
  puVar47 = data;
  local_48 = filtered_data;
  while( true ) {
    puVar49 = puVar49 + lVar42;
    if (height <= iVar45) break;
    puVar1 = puVar47 + lVar42;
    local_48 = local_48 + lVar42;
    *local_48 = *puVar1 - puVar1[-lVar42];
    lVar50 = lVar51;
    for (lVar46 = 0; lVar46 < (int)(length & 0xfffffff8); lVar46 = lVar46 + 8) {
      uVar2 = *(ulong *)(puVar49 + lVar46 + -1);
      uVar3 = *(ulong *)(puVar47 + lVar46 + 1);
      uVar4 = *(ulong *)(puVar47 + lVar46);
      uVar5 = *(undefined8 *)(puVar49 + lVar46);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar2;
      auVar6[0xe] = (char)(uVar2 >> 0x38);
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar2;
      auVar9[0xc] = (char)(uVar2 >> 0x30);
      auVar9._13_2_ = auVar6._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12._12_3_ = auVar9._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar2;
      auVar15[10] = (char)(uVar2 >> 0x28);
      auVar15._11_4_ = auVar12._11_4_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar2;
      auVar18._10_5_ = auVar15._10_5_;
      auVar21[8] = (char)(uVar2 >> 0x20);
      auVar21._0_8_ = uVar2;
      auVar21._9_6_ = auVar18._9_6_;
      auVar27._7_8_ = 0;
      auVar27._0_7_ = auVar21._8_7_;
      Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar36._9_6_ = 0;
      auVar36._0_9_ = Var28;
      auVar29._1_10_ = SUB1510(auVar36 << 0x30,5);
      auVar29[0] = (char)(uVar2 >> 0x10);
      auVar37._11_4_ = 0;
      auVar37._0_11_ = auVar29;
      auVar24[2] = (char)(uVar2 >> 8);
      auVar24._0_2_ = (ushort)uVar2;
      auVar24._3_12_ = SUB1512(auVar37 << 0x20,3);
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7[0xe] = (char)(uVar3 >> 0x38);
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar3;
      auVar10[0xc] = (char)(uVar3 >> 0x30);
      auVar10._13_2_ = auVar7._13_2_;
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar3;
      auVar13._12_3_ = auVar10._12_3_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar3;
      auVar16[10] = (char)(uVar3 >> 0x28);
      auVar16._11_4_ = auVar13._11_4_;
      auVar19._8_2_ = 0;
      auVar19._0_8_ = uVar3;
      auVar19._10_5_ = auVar16._10_5_;
      auVar22[8] = (char)(uVar3 >> 0x20);
      auVar22._0_8_ = uVar3;
      auVar22._9_6_ = auVar19._9_6_;
      auVar30._7_8_ = 0;
      auVar30._0_7_ = auVar22._8_7_;
      Var31 = CONCAT81(SUB158(auVar30 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar38._9_6_ = 0;
      auVar38._0_9_ = Var31;
      auVar32._1_10_ = SUB1510(auVar38 << 0x30,5);
      auVar32[0] = (char)(uVar3 >> 0x10);
      auVar39._11_4_ = 0;
      auVar39._0_11_ = auVar32;
      auVar25[2] = (char)(uVar3 >> 8);
      auVar25._0_2_ = (ushort)uVar3;
      auVar25._3_12_ = SUB1512(auVar39 << 0x20,3);
      auVar8._8_6_ = 0;
      auVar8._0_8_ = uVar4;
      auVar8[0xe] = (char)(uVar4 >> 0x38);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar4;
      auVar11[0xc] = (char)(uVar4 >> 0x30);
      auVar11._13_2_ = auVar8._13_2_;
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar4;
      auVar14._12_3_ = auVar11._12_3_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar4;
      auVar17[10] = (char)(uVar4 >> 0x28);
      auVar17._11_4_ = auVar14._11_4_;
      auVar20._8_2_ = 0;
      auVar20._0_8_ = uVar4;
      auVar20._10_5_ = auVar17._10_5_;
      auVar23[8] = (char)(uVar4 >> 0x20);
      auVar23._0_8_ = uVar4;
      auVar23._9_6_ = auVar20._9_6_;
      auVar33._7_8_ = 0;
      auVar33._0_7_ = auVar23._8_7_;
      Var34 = CONCAT81(SUB158(auVar33 << 0x40,7),(char)(uVar4 >> 0x18));
      auVar40._9_6_ = 0;
      auVar40._0_9_ = Var34;
      auVar35._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar35[0] = (char)(uVar4 >> 0x10);
      auVar41._11_4_ = 0;
      auVar41._0_11_ = auVar35;
      auVar26[2] = (char)(uVar4 >> 8);
      auVar26._0_2_ = (ushort)uVar4;
      auVar26._3_12_ = SUB1512(auVar41 << 0x20,3);
      sVar52 = (((ushort)uVar3 & 0xff) + ((ushort)uVar2 & 0xff)) - ((ushort)uVar4 & 0xff);
      sVar53 = (auVar25._2_2_ + auVar24._2_2_) - auVar26._2_2_;
      sVar54 = (auVar32._0_2_ + auVar29._0_2_) - auVar35._0_2_;
      sVar55 = ((short)Var31 + (short)Var28) - (short)Var34;
      sVar56 = (auVar22._8_2_ + auVar21._8_2_) - auVar23._8_2_;
      sVar57 = (auVar16._10_2_ + auVar15._10_2_) - auVar17._10_2_;
      sVar58 = (auVar10._12_2_ + auVar9._12_2_) - auVar11._12_2_;
      sVar59 = ((auVar7._13_2_ >> 8) + (auVar6._13_2_ >> 8)) - (auVar8._13_2_ >> 8);
      *(ulong *)(puVar48 + lVar46) =
           CONCAT17((char)((ulong)uVar5 >> 0x38) -
                    ((0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59)),
                    CONCAT16((char)((ulong)uVar5 >> 0x30) -
                             ((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58)),
                             CONCAT15((char)((ulong)uVar5 >> 0x28) -
                                      ((0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 -
                                      (0xff < sVar57)),
                                      CONCAT14((char)((ulong)uVar5 >> 0x20) -
                                               ((0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 -
                                               (0xff < sVar56)),
                                               CONCAT13((char)((ulong)uVar5 >> 0x18) -
                                                        ((0 < sVar55) * (sVar55 < 0x100) *
                                                         (char)sVar55 - (0xff < sVar55)),
                                                        CONCAT12((char)((ulong)uVar5 >> 0x10) -
                                                                 ((0 < sVar54) * (sVar54 < 0x100) *
                                                                  (char)sVar54 - (0xff < sVar54)),
                                                                 CONCAT11((char)((ulong)uVar5 >> 8)
                                                                          - ((0 < sVar53) *
                                                                             (sVar53 < 0x100) *
                                                                             (char)sVar53 -
                                                                            (0xff < sVar53)),
                                                                          (char)uVar5 -
                                                                          ((0 < sVar52) *
                                                                           (sVar52 < 0x100) *
                                                                           (char)sVar52 -
                                                                          (0xff < sVar52)))))))));
      lVar50 = lVar50 + 8;
    }
    for (; lVar46 < (int)length; lVar46 = lVar46 + 1) {
      iVar44 = ((uint)data[lVar50] + (uint)data[lVar50 + lVar42 + -1]) - (uint)data[lVar50 + -1];
      if (iVar44 < 1) {
        iVar44 = 0;
      }
      cVar43 = (char)iVar44;
      if (0xfe < iVar44) {
        cVar43 = -1;
      }
      filtered_data[lVar50 + lVar42] = data[lVar50 + lVar42] - cVar43;
      lVar50 = lVar50 + 1;
    }
    iVar45 = iVar45 + 1;
    puVar48 = puVar48 + lVar42;
    lVar51 = lVar51 + lVar42;
    puVar47 = puVar1;
  }
  return;
}

Assistant:

static void GradientFilter_SSE2(const uint8_t* data, int width, int height,
                                int stride, uint8_t* filtered_data) {
  DoGradientFilter_SSE2(data, width, height, stride, 0, height, filtered_data);
}